

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

block * fold_edge(block *child,edge *ep)

{
  bool bVar1;
  block *local_40;
  int local_38;
  int code;
  int oval1;
  int oval0;
  int aval1;
  int aval0;
  int sense;
  edge *ep_local;
  block *child_local;
  
  local_38 = ep->code;
  bVar1 = local_38 < 0;
  if (bVar1) {
    local_38 = -local_38;
  }
  if ((child->s).code == local_38) {
    if (child->val[0x10] == ep->pred->val[0x10]) {
      if (child->oval == ep->pred->oval) {
        if (bVar1) {
          local_40 = (child->ef).succ;
        }
        else {
          local_40 = (child->et).succ;
        }
        child_local = local_40;
      }
      else if ((bVar1) || (local_38 != 0x15)) {
        child_local = (block *)0x0;
      }
      else {
        child_local = (child->ef).succ;
      }
    }
    else {
      child_local = (block *)0x0;
    }
  }
  else {
    child_local = (block *)0x0;
  }
  return child_local;
}

Assistant:

static struct block *
fold_edge(struct block *child, struct edge *ep)
{
	int sense;
	int aval0, aval1, oval0, oval1;
	int code = ep->code;

	if (code < 0) {
		code = -code;
		sense = 0;
	} else
		sense = 1;

	if (child->s.code != code)
		return 0;

	aval0 = child->val[A_ATOM];
	oval0 = child->oval;
	aval1 = ep->pred->val[A_ATOM];
	oval1 = ep->pred->oval;

	if (aval0 != aval1)
		return 0;

	if (oval0 == oval1)
		/*
		 * The operands of the branch instructions are
		 * identical, so the result is true if a true
		 * branch was taken to get here, otherwise false.
		 */
		return sense ? JT(child) : JF(child);

	if (sense && code == (BPF_JMP|BPF_JEQ|BPF_K))
		/*
		 * At this point, we only know the comparison if we
		 * came down the true branch, and it was an equality
		 * comparison with a constant.
		 *
		 * I.e., if we came down the true branch, and the branch
		 * was an equality comparison with a constant, we know the
		 * accumulator contains that constant.  If we came down
		 * the false branch, or the comparison wasn't with a
		 * constant, we don't know what was in the accumulator.
		 *
		 * We rely on the fact that distinct constants have distinct
		 * value numbers.
		 */
		return JF(child);

	return 0;
}